

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O2

REF_STATUS ref_metric_integrate2(ref_metric_integrand2 integrand,void *state,REF_DBL *integral)

{
  uint uVar1;
  double in_RAX;
  long lVar2;
  REF_DBL (*paRVar3) [3];
  REF_DBL value;
  double local_38;
  
  *integral = 0.0;
  paRVar3 = baryq2;
  lVar2 = 0;
  local_38 = in_RAX;
  while( true ) {
    if (lVar2 == 200) {
      return 0;
    }
    uVar1 = (*integrand)(state,*paRVar3,&local_38);
    if (uVar1 != 0) break;
    *integral = *(double *)((long)weightq2 + lVar2) * local_38 + *integral;
    lVar2 = lVar2 + 8;
    paRVar3 = paRVar3 + 1;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",0xe74,
         "ref_metric_integrate2",(ulong)uVar1,"eval");
  return uVar1;
}

Assistant:

REF_FCN REF_STATUS ref_metric_integrate2(ref_metric_integrand2 integrand,
                                         void *state, REF_DBL *integral) {
  REF_INT i;
  REF_DBL value;
  *integral = 0.0;
  for (i = 0; i < nq2; i++) {
    RSS(integrand(state, baryq2[i], &value), "eval");
    *integral += weightq2[i] * value;
  }

  return REF_SUCCESS;
}